

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_Mesh::UnitizeFaceNormals(ON_Mesh *this)

{
  bool bVar1;
  int iVar2;
  ON_3fVector *this_00;
  float *pfVar3;
  undefined1 local_40 [8];
  ON_3dVector N;
  float *pfStack_20;
  int i;
  float *n;
  int face_count;
  bool rc;
  ON_Mesh *this_local;
  
  n._7_1_ = HasFaceNormals(this);
  if (n._7_1_) {
    iVar2 = FaceCount(this);
    this_00 = ON_SimpleArray<ON_3fVector>::operator[]
                        (&(this->m_FN).super_ON_SimpleArray<ON_3fVector>,0);
    pfStack_20 = ON_3fVector::operator[](this_00,0);
    for (N.z._4_4_ = 0; N.z._4_4_ < iVar2; N.z._4_4_ = N.z._4_4_ + 1) {
      local_40 = (undefined1  [8])(double)*pfStack_20;
      N.x = (double)pfStack_20[1];
      N.y = (double)pfStack_20[2];
      bVar1 = ON_3dVector::Unitize((ON_3dVector *)local_40);
      if (!bVar1) {
        n._7_1_ = false;
      }
      *pfStack_20 = (float)(double)local_40;
      pfVar3 = pfStack_20 + 2;
      pfStack_20[1] = (float)N.x;
      pfStack_20 = pfStack_20 + 3;
      *pfVar3 = (float)N.y;
    }
  }
  return n._7_1_;
}

Assistant:

bool ON_Mesh::UnitizeFaceNormals()
{
  bool rc = HasFaceNormals();
  if ( rc ) {
    const int face_count = FaceCount();
    float* n = &m_FN[0][0];
    int i;
    ON_3dVector N;
    for ( i = 0; i < face_count; i++ ) {
      N.x = n[0];
      N.y = n[1];
      N.z = n[2];
      if ( !N.Unitize() )
        rc = false;
      *n++ = (float)N.x;
      *n++ = (float)N.y;
      *n++ = (float)N.z;
    }
  }
  return rc;
}